

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:913:5)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:913:5)>
      *this)

{
  ExceptionOrValue local_170;
  char local_10;
  
  local_170.exception.ptr.isSet = false;
  local_10 = '\0';
  waitImpl((Own<kj::_::PromiseNode> *)(this->func).promise2,&local_170,(this->func).ws);
  if (local_10 == '\x01') {
    if (local_170.exception.ptr.isSet != false) {
      throwRecoverableException(&local_170.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_170.exception.ptr.isSet == false) {
      unreachable();
    }
    throwRecoverableException(&local_170.exception.ptr.field_1.value,0);
  }
  if (local_170.exception.ptr.isSet == true) {
    Exception::~Exception(&local_170.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void run() override {
    func();
  }